

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O3

void av1_lowbd_fwd_txfm2d_64x16_sse2
               (int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  short *psVar1;
  undefined4 *puVar2;
  int32_t *piVar3;
  byte bVar4;
  undefined2 uVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  undefined8 uVar10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  int8_t *piVar16;
  bool bVar17;
  int16_t *piVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  __m128i *input_00;
  bool bVar22;
  undefined4 uVar23;
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined4 uVar28;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar40 [16];
  undefined4 uVar44;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar52 [16];
  undefined4 uVar53;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  __m128i buf0 [64];
  __m128i buf1 [128];
  longlong local_c38 [2];
  undefined2 auStack_c28 [8];
  undefined1 auStack_c18 [16];
  undefined2 auStack_c08 [8];
  undefined1 auStack_bf8 [16];
  undefined2 auStack_be8 [8];
  undefined1 auStack_bd8 [16];
  undefined2 auStack_bc8 [456];
  undefined8 local_838;
  short asStack_830 [4];
  undefined8 auStack_828 [2];
  undefined4 auStack_818 [8];
  undefined8 uStack_7f8;
  undefined8 auStack_7f0 [3];
  undefined4 auStack_7d8 [2];
  undefined8 auStack_7d0 [2];
  undefined8 uStack_7c0;
  undefined1 auVar24 [12];
  undefined1 auVar26 [16];
  undefined1 auVar29 [12];
  undefined1 auVar33 [16];
  undefined1 auVar30 [16];
  undefined1 auVar34 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar45 [12];
  undefined1 auVar46 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar54 [12];
  undefined1 auVar55 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  
  piVar16 = av1_fwd_txfm_shift_ls[0x12];
  lVar20 = 0;
  do {
    lVar19 = 0;
    piVar18 = input;
    do {
      uVar10 = *(undefined8 *)(piVar18 + 4);
      *(undefined8 *)((long)local_c38 + lVar19) = *(undefined8 *)piVar18;
      *(undefined8 *)((long)local_c38 + lVar19 + 8) = uVar10;
      lVar19 = lVar19 + 0x10;
      piVar18 = piVar18 + stride;
    } while (lVar19 != 0x100);
    bVar4 = *piVar16;
    if ((char)bVar4 < '\0') {
      auVar25 = ZEXT416((uint)(1 << (~bVar4 & 0x1f)));
      auVar25 = pshuflw(auVar25,auVar25,0);
      auVar25._4_4_ = auVar25._0_4_;
      auVar25._8_4_ = auVar25._0_4_;
      auVar25._12_4_ = auVar25._0_4_;
      lVar19 = 0;
      do {
        auVar35 = paddsw(*(undefined1 (*) [16])((long)local_c38 + lVar19),auVar25);
        auVar35 = psraw(auVar35,ZEXT416((uint)-(int)(char)bVar4));
        *(undefined1 (*) [16])((long)local_c38 + lVar19) = auVar35;
        lVar19 = lVar19 + 0x10;
      } while (lVar19 != 0x100);
    }
    else if (bVar4 != 0) {
      lVar19 = 0;
      do {
        auVar25 = psllw(*(undefined1 (*) [16])((long)local_c38 + lVar19),
                        ZEXT416((uint)(int)(char)bVar4));
        *(undefined1 (*) [16])((long)local_c38 + lVar19) = auVar25;
        lVar19 = lVar19 + 0x10;
      } while (lVar19 != 0x100);
    }
    fdct8x16_new_sse2(&local_c38,&local_c38,'\r');
    bVar4 = piVar16[1];
    if ((char)bVar4 < '\0') {
      auVar25 = ZEXT416((uint)(1 << (~bVar4 & 0x1f)));
      auVar25 = pshuflw(auVar25,auVar25,0);
      auVar35._0_4_ = auVar25._0_4_;
      auVar35._4_4_ = auVar35._0_4_;
      auVar35._8_4_ = auVar35._0_4_;
      auVar35._12_4_ = auVar35._0_4_;
      lVar19 = 0;
      do {
        auVar25 = paddsw(*(undefined1 (*) [16])((long)local_c38 + lVar19),auVar35);
        auVar25 = psraw(auVar25,ZEXT416((uint)-(int)(char)bVar4));
        *(undefined1 (*) [16])((long)local_c38 + lVar19) = auVar25;
        lVar19 = lVar19 + 0x10;
      } while (lVar19 != 0x100);
    }
    else if (bVar4 != 0) {
      lVar19 = 0;
      do {
        auVar25 = psllw(*(undefined1 (*) [16])((long)local_c38 + lVar19),
                        ZEXT416((uint)(int)(char)bVar4));
        *(undefined1 (*) [16])((long)local_c38 + lVar19) = auVar25;
        lVar19 = lVar19 + 0x10;
      } while (lVar19 != 0x100);
    }
    lVar19 = 0;
    bVar17 = true;
    do {
      bVar22 = bVar17;
      lVar21 = lVar19 * 0x80;
      auVar25 = *(undefined1 (*) [16])(local_c38 + lVar19 * 0x10);
      auVar35 = *(undefined1 (*) [16])(auStack_c18 + lVar21);
      auVar39._0_12_ = auVar25._0_12_;
      auVar39._12_2_ = auVar25._6_2_;
      auVar39._14_2_ = auStack_c28[lVar19 * 0x40 + 3];
      auVar38._12_4_ = auVar39._12_4_;
      auVar38._0_10_ = auVar25._0_10_;
      auVar38._10_2_ = auStack_c28[lVar19 * 0x40 + 2];
      auVar37._10_6_ = auVar38._10_6_;
      auVar37._0_8_ = auVar25._0_8_;
      auVar37._8_2_ = auVar25._4_2_;
      auVar11._4_8_ = auVar37._8_8_;
      auVar11._2_2_ = auStack_c28[lVar19 * 0x40 + 1];
      auVar11._0_2_ = auVar25._2_2_;
      auVar36._0_4_ = CONCAT22(auStack_c28[lVar19 * 0x40],auVar25._0_2_);
      auVar36._4_12_ = auVar11;
      auVar51._0_12_ = auVar35._0_12_;
      auVar51._12_2_ = auVar35._6_2_;
      auVar51._14_2_ = auStack_c08[lVar19 * 0x40 + 3];
      auVar50._12_4_ = auVar51._12_4_;
      auVar50._0_10_ = auVar35._0_10_;
      auVar50._10_2_ = auStack_c08[lVar19 * 0x40 + 2];
      auVar49._10_6_ = auVar50._10_6_;
      auVar49._0_8_ = auVar35._0_8_;
      auVar49._8_2_ = auVar35._4_2_;
      auVar12._4_8_ = auVar49._8_8_;
      auVar12._2_2_ = auStack_c08[lVar19 * 0x40 + 1];
      auVar12._0_2_ = auVar35._2_2_;
      auVar30 = *(undefined1 (*) [16])(auStack_bf8 + lVar21);
      auVar43._0_12_ = auVar30._0_12_;
      auVar43._12_2_ = auVar30._6_2_;
      auVar43._14_2_ = auStack_be8[lVar19 * 0x40 + 3];
      auVar42._12_4_ = auVar43._12_4_;
      auVar42._0_10_ = auVar30._0_10_;
      auVar42._10_2_ = auStack_be8[lVar19 * 0x40 + 2];
      auVar41._10_6_ = auVar42._10_6_;
      auVar41._0_8_ = auVar30._0_8_;
      auVar41._8_2_ = auVar30._4_2_;
      auVar13._4_8_ = auVar41._8_8_;
      auVar13._2_2_ = auStack_be8[lVar19 * 0x40 + 1];
      auVar13._0_2_ = auVar30._2_2_;
      auVar40._0_4_ = CONCAT22(auStack_be8[lVar19 * 0x40],auVar30._0_2_);
      auVar40._4_12_ = auVar13;
      auVar39 = *(undefined1 (*) [16])(auStack_bd8 + lVar21);
      uVar5 = auStack_bc8[lVar19 * 0x40];
      auVar59._0_12_ = auVar39._0_12_;
      auVar59._12_2_ = auVar39._6_2_;
      auVar59._14_2_ = auStack_bc8[lVar19 * 0x40 + 3];
      auVar58._12_4_ = auVar59._12_4_;
      auVar58._0_10_ = auVar39._0_10_;
      auVar58._10_2_ = auStack_bc8[lVar19 * 0x40 + 2];
      auVar57._10_6_ = auVar58._10_6_;
      auVar57._0_8_ = auVar39._0_8_;
      auVar57._8_2_ = auVar39._4_2_;
      auVar14._4_8_ = auVar57._8_8_;
      auVar14._2_2_ = auStack_bc8[lVar19 * 0x40 + 1];
      auVar14._0_2_ = auVar39._2_2_;
      uVar23 = CONCAT22(auStack_c28[lVar19 * 0x40 + 4],auVar25._8_2_);
      auVar24._0_8_ =
           CONCAT26(*(undefined2 *)(auStack_c18 + lVar21 + -6),CONCAT24(auVar25._10_2_,uVar23));
      auVar24._8_2_ = auVar25._12_2_;
      auVar24._10_2_ = *(undefined2 *)(auStack_c18 + lVar21 + -4);
      auVar26._12_2_ = auVar25._14_2_;
      auVar26._0_12_ = auVar24;
      auVar26._14_2_ = *(undefined2 *)(auStack_c18 + lVar21 + -2);
      uVar44 = CONCAT22(auStack_c08[lVar19 * 0x40 + 4],auVar35._8_2_);
      auVar45._0_8_ =
           CONCAT26(*(undefined2 *)(auStack_bf8 + lVar21 + -6),CONCAT24(auVar35._10_2_,uVar44));
      auVar45._8_2_ = auVar35._12_2_;
      auVar45._10_2_ = *(undefined2 *)(auStack_bf8 + lVar21 + -4);
      auVar46._12_2_ = auVar35._14_2_;
      auVar46._0_12_ = auVar45;
      auVar46._14_2_ = *(undefined2 *)(auStack_bf8 + lVar21 + -2);
      uVar28 = CONCAT22(auStack_be8[lVar19 * 0x40 + 4],auVar30._8_2_);
      auVar29._0_8_ =
           CONCAT26(*(undefined2 *)(auStack_bd8 + lVar21 + -6),CONCAT24(auVar30._10_2_,uVar28));
      auVar29._8_2_ = auVar30._12_2_;
      auVar29._10_2_ = *(undefined2 *)(auStack_bd8 + lVar21 + -4);
      auVar30._12_2_ = auVar30._14_2_;
      auVar30._0_12_ = auVar29;
      auVar30._14_2_ = *(undefined2 *)(auStack_bd8 + lVar21 + -2);
      uVar53 = CONCAT22(auStack_bc8[lVar19 * 0x40 + 4],auVar39._8_2_);
      auVar54._0_8_ = CONCAT26(auStack_bc8[lVar19 * 0x40 + 5],CONCAT24(auVar39._10_2_,uVar53));
      auVar54._8_2_ = auVar39._12_2_;
      auVar54._10_2_ = auStack_bc8[lVar19 * 0x40 + 6];
      auVar55._12_2_ = auVar39._14_2_;
      auVar55._0_12_ = auVar54;
      auVar55._14_2_ = auStack_bc8[lVar19 * 0x40 + 7];
      auVar47._0_8_ = auVar36._0_8_;
      auVar47._8_4_ = auVar11._0_4_;
      auVar47._12_4_ = auVar12._0_4_;
      auVar48._0_8_ = auVar40._0_8_;
      auVar48._8_4_ = auVar13._0_4_;
      auVar48._12_4_ = auVar14._0_4_;
      auVar52._8_4_ = (int)((ulong)auVar24._0_8_ >> 0x20);
      auVar52._0_8_ = auVar24._0_8_;
      auVar52._12_4_ = (int)((ulong)auVar45._0_8_ >> 0x20);
      auVar56._8_4_ = (int)((ulong)auVar29._0_8_ >> 0x20);
      auVar56._0_8_ = auVar29._0_8_;
      auVar56._12_4_ = (int)((ulong)auVar54._0_8_ >> 0x20);
      auVar31._0_8_ = CONCAT44(auVar54._8_4_,auVar29._8_4_);
      auVar31._8_4_ = auVar30._12_4_;
      auVar31._12_4_ = auVar55._12_4_;
      (&local_838)[lVar20 * 0x10 + lVar19 * 0x80] =
           CONCAT44(CONCAT22(auStack_c08[lVar19 * 0x40],auVar35._0_2_),auVar36._0_4_);
      (&local_838 + lVar20 * 0x10 + lVar19 * 0x80)[1] =
           CONCAT44(CONCAT22(uVar5,auVar39._0_2_),auVar40._0_4_);
      auStack_828[lVar20 * 0x10 + lVar19 * 0x80] = auVar47._8_8_;
      (auStack_828 + lVar20 * 0x10 + lVar19 * 0x80)[1] = auVar48._8_8_;
      puVar2 = auStack_818 + lVar20 * 0x20 + lVar19 * 0x100;
      *puVar2 = auVar37._8_4_;
      puVar2[1] = auVar49._8_4_;
      puVar2[2] = auVar41._8_4_;
      puVar2[3] = auVar57._8_4_;
      auStack_818[lVar20 * 0x20 + lVar19 * 0x100 + 6] = auVar38._12_4_;
      auStack_818[lVar20 * 0x20 + lVar19 * 0x100 + 7] = auVar50._12_4_;
      *(undefined4 *)(&uStack_7f8 + lVar20 * 0x10 + lVar19 * 0x80) = auVar42._12_4_;
      *(undefined4 *)((long)&uStack_7f8 + lVar19 * 0x400 + lVar20 * 0x80 + 4) = auVar58._12_4_;
      (&uStack_7f8)[lVar20 * 0x10 + lVar19 * 0x80] = CONCAT44(uVar44,uVar23);
      (&uStack_7f8 + lVar20 * 0x10 + lVar19 * 0x80)[1] = CONCAT44(uVar53,uVar28);
      auStack_7f0[lVar20 * 0x10 + lVar19 * 0x80 + 1] = auVar52._8_8_;
      (auStack_7f0 + lVar20 * 0x10 + lVar19 * 0x80 + 1)[1] = auVar56._8_8_;
      puVar2 = auStack_7d8 + lVar20 * 0x20 + lVar19 * 0x100;
      *puVar2 = auVar24._8_4_;
      puVar2[1] = auVar45._8_4_;
      *(undefined8 *)(puVar2 + 2) = auVar31._0_8_;
      *(int *)(&uStack_7c0 + lVar20 * 0x10 + lVar19 * 0x80) = auVar26._12_4_;
      *(int *)((long)&uStack_7c0 + lVar19 * 0x400 + lVar20 * 0x80 + 4) = auVar46._12_4_;
      (&uStack_7c0)[lVar20 * 0x10 + lVar19 * 0x80] = auVar31._8_8_;
      lVar19 = 1;
      bVar17 = false;
    } while (bVar22);
    lVar20 = lVar20 + 1;
    input = input + 8;
  } while (lVar20 != 8);
  lVar20 = 0;
  bVar17 = true;
  do {
    bVar22 = bVar17;
    input_00 = (__m128i *)(&local_838 + lVar20 * 0x80);
    av1_fdct8x64_new_sse2(input_00,input_00,'\f');
    bVar4 = piVar16[2];
    if ((char)bVar4 < '\0') {
      auVar25 = ZEXT416((uint)(1 << (~bVar4 & 0x1f)));
      auVar25 = pshuflw(auVar25,auVar25,0);
      auVar27._0_4_ = auVar25._0_4_;
      auVar27._4_4_ = auVar27._0_4_;
      auVar27._8_4_ = auVar27._0_4_;
      auVar27._12_4_ = auVar27._0_4_;
      auVar31 = ZEXT416((uint)-(int)(char)bVar4);
      lVar19 = 0;
      do {
        auVar25 = paddsw(*(undefined1 (*) [16])((long)*input_00 + lVar19),auVar27);
        auVar25 = psraw(auVar25,auVar31);
        *(undefined1 (*) [16])((long)*input_00 + lVar19) = auVar25;
        lVar19 = lVar19 + 0x10;
      } while (lVar19 != 0x400);
    }
    else if (bVar4 != 0) {
      lVar19 = 0;
      do {
        auVar31 = psllw(*(undefined1 (*) [16])((long)*input_00 + lVar19),
                        ZEXT416((uint)(int)(char)bVar4));
        *(undefined1 (*) [16])((long)*input_00 + lVar19) = auVar31;
        lVar19 = lVar19 + 0x10;
      } while (lVar19 != 0x400);
    }
    lVar19 = 0;
    do {
      psVar1 = (short *)((long)*input_00 + lVar19);
      sVar6 = psVar1[4];
      sVar7 = psVar1[5];
      sVar8 = psVar1[6];
      sVar9 = psVar1[7];
      auVar34._0_12_ = auVar31._0_12_;
      auVar34._12_2_ = auVar31._6_2_;
      auVar34._14_2_ = psVar1[3];
      auVar33._12_4_ = auVar34._12_4_;
      auVar33._0_10_ = auVar31._0_10_;
      auVar33._10_2_ = psVar1[2];
      auVar32._10_6_ = auVar33._10_6_;
      auVar32._0_8_ = auVar31._0_8_;
      auVar32._8_2_ = auVar31._4_2_;
      auVar15._4_8_ = auVar32._8_8_;
      auVar15._2_2_ = psVar1[1];
      auVar15._0_2_ = auVar31._2_2_;
      auVar31._0_4_ = (int)*psVar1;
      auVar31._4_4_ = auVar15._0_4_ >> 0x10;
      auVar31._8_4_ = auVar32._8_4_ >> 0x10;
      auVar31._12_4_ = auVar33._12_4_ >> 0x10;
      *(undefined1 (*) [16])(output + lVar20 * 8 + lVar19) = auVar31;
      piVar3 = output + lVar20 * 8 + lVar19 + 4;
      *piVar3 = (int)sVar6;
      piVar3[1] = (int)sVar7;
      piVar3[2] = (int)sVar8;
      piVar3[3] = (int)sVar9;
      lVar19 = lVar19 + 0x10;
    } while (lVar19 != 0x200);
    lVar20 = 1;
    bVar17 = false;
  } while (bVar22);
  memset(output + 0x200,0,0x800);
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_64x16_sse2(const int16_t *input, int32_t *output,
                                     int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  (void)tx_type;
  assert(tx_type == DCT_DCT);
  const TX_SIZE tx_size = TX_64X16;
  __m128i buf0[64], buf1[128];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_sse2 col_txfm = fdct8x16_new_sse2;
  const transform_1d_sse2 row_txfm = av1_fdct8x64_new_sse2;
  const int width_div8 = (width >> 3);
  const int height_div8 = (height >> 3);

  for (int i = 0; i < width_div8; i++) {
    load_buffer_16bit_to_16bit(input + 8 * i, stride, buf0, height);
    round_shift_16bit(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit(buf0, height, shift[1]);
    for (int j = 0; j < height_div8; ++j) {
      transpose_16bit_8x8(buf0 + j * 8, buf1 + j * width + 8 * i);
    }
  }

  for (int i = 0; i < height_div8; i++) {
    __m128i *buf = buf1 + width * i;
    row_txfm(buf, buf, cos_bit_row);
    round_shift_16bit(buf, width, shift[2]);
    store_buffer_16bit_to_32bit_w8(buf, output + 8 * i, 16, 32);
  }
  // Zero out the bottom 16x32 area.
  memset(output + 16 * 32, 0, 16 * 32 * sizeof(*output));
}